

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::DebugInfoManager::AnalyzeDebugInsts(DebugInfoManager *this,Module *module)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  Instruction *pIVar3;
  CommonDebugInfoInstructions CVar4;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  this->deref_operation_ = (Instruction *)0x0;
  this->debug_info_none_inst_ = (Instruction *)0x0;
  this->empty_debug_expr_inst_ = (Instruction *)0x0;
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp:829:22)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp:829:22)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  Module::ForEachInst(module,(function<void_(spvtools::opt::Instruction_*)> *)&local_38,false);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (((this->empty_debug_expr_inst_ != (Instruction *)0x0) &&
      (pIVar1 = (this->empty_debug_expr_inst_->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                previous_node_, pIVar1 != (Instruction *)0x0)) &&
     ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    CVar4 = Instruction::GetCommonDebugOpcode(pIVar1);
    if (CVar4 != CommonDebugInfoInstructionsMax) {
      pIVar1 = this->empty_debug_expr_inst_;
      if ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == true)
      goto LAB_00599b23;
      pIVar2 = *(Instruction **)
                ((long)&((this->context_->module_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                         .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                        ext_inst_debuginfo_ + 0x10);
      if ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ ==
          (Instruction *)0x0) goto LAB_00599b42;
      pIVar3 = (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if (pIVar3 != (Instruction *)0x0) {
        (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
             (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
        (((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
        super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar3;
        (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ =
             (Instruction *)0x0;
        (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
             (Instruction *)0x0;
      }
      (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar2;
      (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar1;
      (((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
      super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar1;
    }
  }
  if (((this->debug_info_none_inst_ != (Instruction *)0x0) &&
      (pIVar1 = (this->debug_info_none_inst_->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                previous_node_, pIVar1 != (Instruction *)0x0)) &&
     ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    CVar4 = Instruction::GetCommonDebugOpcode(pIVar1);
    if (CVar4 != CommonDebugInfoInstructionsMax) {
      pIVar1 = this->debug_info_none_inst_;
      if ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == true) {
LAB_00599b23:
        __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xae,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                     );
      }
      pIVar2 = *(Instruction **)
                ((long)&((this->context_->module_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                         .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                        ext_inst_debuginfo_ + 0x10);
      if ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ ==
          (Instruction *)0x0) {
LAB_00599b42:
        __assert_fail("pos->IsInAList() && \"Pos should already be in a list.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xaf,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                     );
      }
      pIVar3 = (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if (pIVar3 != (Instruction *)0x0) {
        (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
             (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
        (((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
        super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar3;
        (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ =
             (Instruction *)0x0;
        (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
             (Instruction *)0x0;
      }
      (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar2;
      (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar1;
      (((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
      super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar1;
    }
  }
  return;
}

Assistant:

void DebugInfoManager::AnalyzeDebugInsts(Module& module) {
  deref_operation_ = nullptr;
  debug_info_none_inst_ = nullptr;
  empty_debug_expr_inst_ = nullptr;
  module.ForEachInst([this](Instruction* cpi) { AnalyzeDebugInst(cpi); });

  // Move |empty_debug_expr_inst_| to the beginning of the debug instruction
  // list.
  if (empty_debug_expr_inst_ != nullptr &&
      empty_debug_expr_inst_->PreviousNode() != nullptr &&
      empty_debug_expr_inst_->PreviousNode()->IsCommonDebugInstr()) {
    empty_debug_expr_inst_->InsertBefore(
        &*context()->module()->ext_inst_debuginfo_begin());
  }

  // Move |debug_info_none_inst_| to the beginning of the debug instruction
  // list.
  if (debug_info_none_inst_ != nullptr &&
      debug_info_none_inst_->PreviousNode() != nullptr &&
      debug_info_none_inst_->PreviousNode()->IsCommonDebugInstr()) {
    debug_info_none_inst_->InsertBefore(
        &*context()->module()->ext_inst_debuginfo_begin());
  }
}